

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

string_view __thiscall slang::parsing::Token::rawText(Token *this)

{
  TokenKind TVar1;
  string_view sVar2;
  bool bVar3;
  logic_error *this_00;
  string local_108;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string_view text;
  Token *this_local;
  char *local_10;
  
  text._M_str = (char *)this;
  _local_30 = LexerFacts::getTokenKindText(this->kind);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  if (!bVar3) {
    this_local = (Token *)local_30;
    local_10 = (char *)text._M_len;
    goto LAB_00256e5b;
  }
  TVar1 = this->kind;
  if (TVar1 == Unknown) {
    if (this->info == (Info *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,"");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 this->info->rawTextPtr,(ulong)this->rawLen);
    }
    goto LAB_00256e5b;
  }
  if (TVar1 == EndOfFile) {
LAB_00256c56:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,"");
  }
  else {
    if (7 < (ushort)(TVar1 - Identifier)) {
      if (TVar1 == Placeholder) goto LAB_00256c56;
      if ((2 < (ushort)(TVar1 - Directive)) &&
         (TVar1 != EmptyMacroArgument && TVar1 != LineContinuation)) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Token.cpp"
                   ,&local_d1);
        std::operator+(&local_b0,&local_d0,":");
        std::__cxx11::to_string(&local_108,0x125);
        std::operator+(&local_90,&local_b0,&local_108);
        std::operator+(&local_70,&local_90,": ");
        std::operator+(&local_50,&local_70,"Default case should be unreachable!");
        std::logic_error::logic_error(this_00,(string *)&local_50);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               this->info->rawTextPtr,(ulong)this->rawLen);
  }
LAB_00256e5b:
  sVar2._M_str = local_10;
  sVar2._M_len = (size_t)this_local;
  return sVar2;
}

Assistant:

string_view Token::rawText() const {
    string_view text = LexerFacts::getTokenKindText(kind);
    if (!text.empty())
        return text;

    // not a simple token, so extract info from our data pointer
    switch (kind) {
        case TokenKind::Identifier:
        case TokenKind::SystemIdentifier:
        case TokenKind::IncludeFileName:
        case TokenKind::StringLiteral:
        case TokenKind::IntegerLiteral:
        case TokenKind::IntegerBase:
        case TokenKind::UnbasedUnsizedLiteral:
        case TokenKind::RealLiteral:
        case TokenKind::TimeLiteral:
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
        case TokenKind::EmptyMacroArgument:
        case TokenKind::LineContinuation:
            return string_view(info->rawTextPtr, rawLen);
        case TokenKind::Unknown:
            if (info)
                return string_view(info->rawTextPtr, rawLen);
            return "";
        case TokenKind::Placeholder:
        case TokenKind::EndOfFile:
            return "";
        default:
            ASSUME_UNREACHABLE;
    }
}